

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::
TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *this
          ,TPZCompMesh *mesh)

{
  *(undefined8 *)&this->field_0x2d0 = 0x1805bb0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1805c78;
  *(undefined4 *)&this->field_0x2d8 = 0;
  this->field_0x2dc = 1;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::TPZStructMatrix
            (&this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
             ,&PTR_construction_vtable_104__01801630,mesh);
  *(undefined8 *)&this->field_0x2d0 = 0x18015b8;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x18013c8;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x18014b0;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
              ).field_0x148);
  TPZStack<long,_10>::TPZStack(&this->felnum);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(&this->fekstack);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(&this->fefstack);
  this->fMaxStackSize = 500;
  *(undefined4 *)
   ((long)&(this->
           super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>).
           super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh +
   *(long *)(*(long *)&(this->
                       super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>
                       ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60)) = 3;
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}